

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

int32_t icu_63::sortiComparator(void *param_1,void *left,void *right)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*right <= *left) {
    uVar1 = (uint)(*left != *right);
  }
  return uVar1;
}

Assistant:

static int32_t U_CALLCONV
sortiComparator(const void * /*context */, const void *left, const void *right) {
    const UElement *e1 = static_cast<const UElement *>(left);
    const UElement *e2 = static_cast<const UElement *>(right);
    int32_t result = e1->integer < e2->integer? -1 :
                     e1->integer == e2->integer? 0 : 1;
    return result;
}